

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O2

void __thiscall libtorrent::peer_connect_alert::~peer_connect_alert(peer_connect_alert *this)

{
  torrent_alert::~torrent_alert((torrent_alert *)this);
  operator_delete(this,0x68);
  return;
}

Assistant:

struct TORRENT_EXPORT peer_connect_alert final : peer_alert
	{
		enum class direction_t { in, out };

		// internal
		TORRENT_UNEXPORT peer_connect_alert(aux::stack_allocator& alloc, torrent_handle h
			, tcp::endpoint const& ep, peer_id const& peer_id, socket_type_t type, direction_t direction);

		TORRENT_DEFINE_ALERT(peer_connect_alert, 23)

		static inline constexpr alert_category_t static_category = alert_category::connect;
		std::string message() const override;

		// Tells you if the peer was incoming or outgoing
		direction_t direction;

		socket_type_t socket_type;
	}